

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegExecPushString2(xmlRegExecCtxtPtr exec,xmlChar *value,xmlChar *value2,void *data)

{
  int iVar1;
  size_t sVar3;
  size_t sVar4;
  xmlChar *value_00;
  xmlChar buf [150];
  xmlChar local_c8 [152];
  int iVar2;
  
  iVar1 = -1;
  if (((exec != (xmlRegExecCtxtPtr)0x0) && (exec->comp != (xmlRegexpPtr)0x0)) &&
     (iVar1 = exec->status, iVar1 == 0)) {
    if (value2 == (xmlChar *)0x0) {
      iVar1 = xmlRegExecPushStringInternal(exec,value,data,0);
      return iVar1;
    }
    sVar3 = strlen((char *)value2);
    sVar4 = strlen((char *)value);
    iVar2 = (int)sVar4;
    iVar1 = iVar2 + (int)sVar3;
    if (iVar1 < 0x95) {
      value_00 = local_c8;
    }
    else {
      value_00 = (xmlChar *)(*xmlMallocAtomic)((long)iVar1 + 2);
      if (value_00 == (xmlChar *)0x0) {
        exec->status = -1;
        return -1;
      }
    }
    memcpy(value_00,value,(long)iVar2);
    value_00[iVar2] = '|';
    memcpy(value_00 + (iVar2 + 1),value2,(long)(int)sVar3);
    value_00[(long)iVar1 + 1] = '\0';
    if (exec->comp->compact == (int *)0x0) {
      iVar1 = xmlRegExecPushStringInternal(exec,value_00,data,1);
    }
    else {
      iVar1 = xmlRegCompactPushString(exec,exec->comp,value_00,data);
    }
    if (value_00 != local_c8) {
      (*xmlFree)(value_00);
    }
  }
  return iVar1;
}

Assistant:

int
xmlRegExecPushString2(xmlRegExecCtxtPtr exec, const xmlChar *value,
                      const xmlChar *value2, void *data) {
    xmlChar buf[150];
    int lenn, lenp, ret;
    xmlChar *str;

    if (exec == NULL)
	return(-1);
    if (exec->comp == NULL)
	return(-1);
    if (exec->status != 0)
	return(exec->status);

    if (value2 == NULL)
        return(xmlRegExecPushString(exec, value, data));

    lenn = strlen((char *) value2);
    lenp = strlen((char *) value);

    if (150 < lenn + lenp + 2) {
	str = (xmlChar *) xmlMallocAtomic(lenn + lenp + 2);
	if (str == NULL) {
	    exec->status = -1;
	    return(-1);
	}
    } else {
	str = buf;
    }
    memcpy(&str[0], value, lenp);
    str[lenp] = XML_REG_STRING_SEPARATOR;
    memcpy(&str[lenp + 1], value2, lenn);
    str[lenn + lenp + 1] = 0;

    if (exec->comp->compact != NULL)
	ret = xmlRegCompactPushString(exec, exec->comp, str, data);
    else
        ret = xmlRegExecPushStringInternal(exec, str, data, 1);

    if (str != buf)
        xmlFree(str);
    return(ret);
}